

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

void __thiscall
estl::vector_s<std::__cxx11::string,12ul>::vector_s<10ul>
          (vector_s<std::__cxx11::string,12ul> *this,
          vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
          *other)

{
  long lVar1;
  size_type sVar2;
  bool bVar3;
  
  *(undefined8 *)this = 0;
  *(vector_s<std::__cxx11::string,12ul> **)(this + 0x188) = this + 8;
  sVar2 = other->size_;
  lVar1 = sVar2 << 5;
  while( true ) {
    bVar3 = sVar2 == 0;
    sVar2 = sVar2 - 1;
    if (bVar3) break;
    std::__cxx11::string::string
              ((string *)(*(long *)(this + 0x188) + lVar1 + -0x20),
               (string *)((long)&other->data_ptr_[-1]._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  }
  *(size_type *)this = other->size_;
  return;
}

Assistant:

vector_s(const vector_s<T, CAPACITY_OTHER>& other)
    {
        for (size_type i = other.size(); i > 0; ) {
            --i;
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(other[i]);
        }
        size_ = other.size();
    }